

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O3

void us_internal_async_close(us_internal_async *a)

{
  us_poll_stop((us_poll_t *)a,*(us_loop_t **)(a + 0x10));
  close((*(int *)a << 4) >> 4);
  *(int *)(*(long *)(a + 0x10) + 0x58) = *(int *)(*(long *)(a + 0x10) + 0x58) + -1;
  free(a);
  return;
}

Assistant:

void us_internal_async_close(struct us_internal_async *a) {
    struct us_internal_callback_t *cb = (struct us_internal_callback_t *) a;

    us_poll_stop(&cb->p, cb->loop);
    close(us_poll_fd(&cb->p));

    /* (regular) sockets are the only polls which are not freed immediately */
    us_poll_free((struct us_poll_t *) a, cb->loop);
}